

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::anon_unknown_173::print_relationship
                   (string *__return_storage_ptr__,Relationship *rel,ListEditQual *qual,bool custom,
                   string *name,uint32_t indent)

{
  ostream *poVar1;
  undefined7 in_register_00000009;
  uint32_t n;
  ListEditQual v;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n);
  ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::__cxx11::string::_M_dispose();
  if (*qual != ResetToExplicit) {
    tinyusdz::to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*qual,v);
    poVar1 = ::std::operator<<(local_1a8,(string *)&local_1d8);
    ::std::operator<<(poVar1," ");
    ::std::__cxx11::string::_M_dispose();
  }
  if (rel->_varying_authored == true) {
    ::std::operator<<(local_1a8,"varying ");
  }
  print_rel_only(&local_1d8,rel,(string *)CONCAT71(in_register_00000009,custom),(uint32_t)name);
  ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_relationship(const Relationship &rel,
                               const ListEditQual &qual, const bool custom,
                               const std::string &name, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);

  if (custom) {
    ss << "custom ";
  }

  // List editing
  if (qual != ListEditQual::ResetToExplicit) {
    ss << to_string(qual) << " ";
  }

  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}